

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O1

char * sam_hdr_PG_ID(SAM_hdr *sh,char *name)

{
  khint_t kVar1;
  uint uVar2;
  kh_m_s2i_t *pkVar3;
  khint32_t *pkVar4;
  char *pcVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  byte bVar9;
  char *pcVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  khint_t kVar14;
  
  pkVar3 = sh->pg_hash;
  kVar1 = pkVar3->n_buckets;
  if (kVar1 == 0) {
    kVar14 = 0;
  }
  else {
    uVar11 = (uint)*name;
    if (*name == '\0') {
      uVar11 = 0;
    }
    else {
      cVar6 = name[1];
      if (cVar6 != '\0') {
        pcVar10 = name + 2;
        do {
          uVar11 = (int)cVar6 + uVar11 * 0x1f;
          cVar6 = *pcVar10;
          pcVar10 = pcVar10 + 1;
        } while (cVar6 != '\0');
      }
    }
    uVar11 = uVar11 & kVar1 - 1;
    pkVar4 = pkVar3->flags;
    iVar12 = 1;
    uVar13 = uVar11;
    do {
      uVar2 = pkVar4[uVar13 >> 4];
      bVar9 = (char)uVar13 * '\x02' & 0x1e;
      uVar7 = uVar2 >> bVar9;
      if (((uVar7 & 2) != 0) ||
         (((uVar7 & 1) == 0 && (iVar8 = strcmp(pkVar3->keys[uVar13],name), iVar8 == 0)))) {
        kVar14 = uVar13;
        if ((uVar2 >> bVar9 & 3) != 0) {
          kVar14 = kVar1;
        }
        break;
      }
      uVar13 = uVar13 + iVar12 & kVar1 - 1;
      iVar12 = iVar12 + 1;
      kVar14 = kVar1;
    } while (uVar13 != uVar11);
  }
  pcVar10 = name;
  if (kVar14 != kVar1) {
    pcVar10 = sh->ID_buf;
    do {
      sh->ID_cnt = sh->ID_cnt + 1;
      sprintf(pcVar10,"%.1000s.%d",name);
      pkVar3 = sh->pg_hash;
      kVar1 = pkVar3->n_buckets;
      kVar14 = 0;
      if (kVar1 != 0) {
        uVar11 = (uint)*pcVar10;
        if (*pcVar10 == '\0') {
          uVar11 = 0;
        }
        else {
          cVar6 = sh->ID_buf[1];
          pcVar5 = sh->ID_buf + 2;
          while (cVar6 != '\0') {
            uVar11 = (int)cVar6 + uVar11 * 0x1f;
            cVar6 = *pcVar5;
            pcVar5 = pcVar5 + 1;
          }
        }
        uVar11 = uVar11 & kVar1 - 1;
        pkVar4 = pkVar3->flags;
        iVar12 = 1;
        uVar13 = uVar11;
        do {
          uVar2 = pkVar4[uVar13 >> 4];
          bVar9 = (char)uVar13 * '\x02' & 0x1e;
          uVar7 = uVar2 >> bVar9;
          if (((uVar7 & 2) != 0) ||
             (((uVar7 & 1) == 0 && (iVar8 = strcmp(pkVar3->keys[uVar13],pcVar10), iVar8 == 0)))) {
            kVar14 = uVar13;
            if ((uVar2 >> bVar9 & 3) != 0) {
              kVar14 = kVar1;
            }
            break;
          }
          uVar13 = uVar13 + iVar12 & kVar1 - 1;
          iVar12 = iVar12 + 1;
          kVar14 = kVar1;
        } while (uVar13 != uVar11);
      }
    } while (kVar14 == kVar1);
  }
  return pcVar10;
}

Assistant:

const char *sam_hdr_PG_ID(SAM_hdr *sh, const char *name) {
    khint_t k = kh_get(m_s2i, sh->pg_hash, name);
    if (k == kh_end(sh->pg_hash))
	return name;

    do {
	sprintf(sh->ID_buf, "%.1000s.%d", name, sh->ID_cnt++);
	k = kh_get(m_s2i, sh->pg_hash, sh->ID_buf);
    } while (k == kh_end(sh->pg_hash));

    return sh->ID_buf;
}